

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O3

void g_traversal_setup(void)

{
  t_symbol *ptVar1;
  _class *p_Var2;
  
  ptVar1 = gensym("pointer");
  p_Var2 = class_new(ptVar1,ptrobj_new,ptrobj_free,0x68,0,A_GIMME,0);
  ptrobj_class = p_Var2;
  ptVar1 = gensym("next");
  class_addmethod(p_Var2,ptrobj_next,ptVar1,A_NULL);
  p_Var2 = ptrobj_class;
  ptVar1 = gensym("send");
  class_addmethod(p_Var2,ptrobj_send,ptVar1,A_SYMBOL);
  p_Var2 = ptrobj_class;
  ptVar1 = gensym("traverse");
  class_addmethod(p_Var2,ptrobj_traverse,ptVar1,A_SYMBOL);
  p_Var2 = ptrobj_class;
  ptVar1 = gensym("vnext");
  class_addmethod(p_Var2,ptrobj_vnext,ptVar1,A_DEFFLOAT);
  p_Var2 = ptrobj_class;
  ptVar1 = gensym("delete");
  class_addmethod(p_Var2,ptrobj_delete,ptVar1,A_NULL);
  p_Var2 = ptrobj_class;
  ptVar1 = gensym("equal");
  class_addmethod(p_Var2,ptrobj_equal,ptVar1,A_POINTER);
  p_Var2 = ptrobj_class;
  ptVar1 = gensym("send-window");
  class_addmethod(p_Var2,ptrobj_sendwindow,ptVar1,A_GIMME);
  p_Var2 = ptrobj_class;
  ptVar1 = gensym("rewind");
  class_addmethod(p_Var2,ptrobj_rewind,ptVar1,A_NULL);
  class_addpointer(ptrobj_class,ptrobj_pointer);
  class_addbang(ptrobj_class,ptrobj_bang);
  ptVar1 = gensym("get");
  get_class = class_new(ptVar1,get_new,get_free,0x48,0,A_GIMME,0);
  class_addpointer(get_class,get_pointer);
  p_Var2 = get_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,get_set,ptVar1,A_SYMBOL,2,0);
  ptVar1 = gensym("set");
  set_class = class_new(ptVar1,set_new,set_free,0x60,0,A_GIMME,0);
  class_doaddfloat(set_class,set_float);
  class_addsymbol(set_class,set_symbol);
  class_addbang(set_class,set_bang);
  p_Var2 = set_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,set_set,ptVar1,A_SYMBOL,2,0);
  ptVar1 = gensym("element");
  elem_class = class_new(ptVar1,elem_new,elem_free,0x70,0,A_DEFSYM,7,0);
  class_doaddfloat(elem_class,elem_float);
  p_Var2 = elem_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,elem_set,ptVar1,A_SYMBOL,2,0);
  ptVar1 = gensym("getsize");
  getsize_class = class_new(ptVar1,getsize_new,(t_method)0x0,0x40,0,A_DEFSYM,7,0);
  class_addpointer(getsize_class,getsize_pointer);
  p_Var2 = getsize_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,getsize_set,ptVar1,A_SYMBOL,2,0);
  ptVar1 = gensym("setsize");
  setsize_class = class_new(ptVar1,setsize_new,setsize_free,0x58,0,A_DEFSYM,7,6,0);
  class_doaddfloat(setsize_class,setsize_float);
  p_Var2 = setsize_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,setsize_set,ptVar1,A_SYMBOL,2,0);
  ptVar1 = gensym("append");
  append_class = class_new(ptVar1,append_new,append_free,0x60,0,A_GIMME,0);
  class_doaddfloat(append_class,append_float);
  p_Var2 = append_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,append_set,ptVar1,A_SYMBOL,2,0);
  return;
}

Assistant:

static void ptrobj_setup(void)
{
    ptrobj_class = class_new(gensym("pointer"), (t_newmethod)ptrobj_new,
        (t_method)ptrobj_free, sizeof(t_ptrobj), 0, A_GIMME, 0);
    class_addmethod(ptrobj_class, (t_method)ptrobj_next, gensym("next"), 0);
    class_addmethod(ptrobj_class, (t_method)ptrobj_send, gensym("send"),
        A_SYMBOL, 0);
    class_addmethod(ptrobj_class, (t_method)ptrobj_traverse, gensym("traverse"),
        A_SYMBOL, 0);
    class_addmethod(ptrobj_class, (t_method)ptrobj_vnext, gensym("vnext"),
        A_DEFFLOAT, 0);
    class_addmethod(ptrobj_class, (t_method)ptrobj_delete, gensym("delete"), 0);
    class_addmethod(ptrobj_class, (t_method)ptrobj_equal, gensym("equal"), A_POINTER, 0);
    class_addmethod(ptrobj_class, (t_method)ptrobj_sendwindow,
        gensym("send-window"), A_GIMME, 0);
    class_addmethod(ptrobj_class, (t_method)ptrobj_rewind,
        gensym("rewind"), 0);
    class_addpointer(ptrobj_class, ptrobj_pointer);
    class_addbang(ptrobj_class, ptrobj_bang);
}